

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# externals.c
# Opt level: O0

char * ucrcourse_strerror(int error)

{
  char *pcStack_10;
  int error_local;
  
  switch(error) {
  case -0x69:
    pcStack_10 = "Server response is malformed";
    break;
  case -0x68:
    pcStack_10 = "Remote server encountered an error";
    break;
  case -0x67:
    pcStack_10 = "Unable to connect to remote";
    break;
  case -0x66:
    pcStack_10 = "Invalid argument(s)";
    break;
  case -0x65:
    pcStack_10 = "cURL returned an error";
    break;
  case -100:
    pcStack_10 = "Internal library error";
    break;
  default:
    pcStack_10 = strerror(error);
  }
  return pcStack_10;
}

Assistant:

const char *ucrcourse_strerror(int error)
{
	switch (error) {
	case UCRCOURSE_ERR_INTERNAL:
		return "Internal library error";
	case UCRCOURSE_ERR_CURL:
		return "cURL returned an error";
	case UCRCOURSE_ERR_INVALID_ARG:
		return "Invalid argument(s)";
	case UCRCOURSE_ERR_CONNECT:
		return "Unable to connect to remote";
	case UCRCOURSE_ERR_SERVER:
		return "Remote server encountered an error";
	case UCRCOURSE_ERR_RESPONSE:
		return "Server response is malformed";
	default:
		return strerror(error);
	}
}